

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLKinematicsIntermediateData.h
# Opt level: O2

void __thiscall
COLLADASaxFWL::KinematicsBindJointAxis::KinematicsBindJointAxis
          (KinematicsBindJointAxis *this,SidAddress *target)

{
  this->_vptr_KinematicsBindJointAxis = (_func_int **)&PTR__KinematicsBindJointAxis_0095e2a8;
  SidAddress::SidAddress(&this->mTarget,target);
  (this->mAxis)._vptr_KinematicsSidrefOrParam = (_func_int **)&PTR__KinematicsSidrefOrParam_00953a88
  ;
  (this->mAxis).mValueType = VALUETYPE_UNKNOWN;
  (this->mAxis).mSymbol._M_dataplus._M_p = (pointer)&(this->mAxis).mSymbol.field_2;
  (this->mAxis).mSymbol._M_string_length = 0;
  (this->mAxis).mSymbol.field_2._M_local_buf[0] = '\0';
  (this->mValue)._vptr_KinematicsFloatOrParam = (_func_int **)&PTR__KinematicsFloatOrParam_00953aa8;
  (this->mValue).mValueType = VALUETYPE_UNKNOWN;
  (this->mValue).mSymbol._M_dataplus._M_p = (pointer)&(this->mValue).mSymbol.field_2;
  (this->mValue).mSymbol._M_string_length = 0;
  (this->mValue).mSymbol.field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

KinematicsBindJointAxis(SidAddress target) : mTarget(target){}